

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall cmMakefileProfilingData::StopEntry(cmMakefileProfilingData *this)

{
  ulong uVar1;
  Value *pVVar2;
  UInt64 value;
  longlong lVar3;
  pointer pSVar4;
  failure *fail;
  Value local_108;
  Value local_e0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  duration<long,_std::ratio<1L,_1000000L>_> local_a8;
  Value local_a0;
  Value local_78;
  undefined1 local_50 [8];
  Value v;
  SystemInformation info;
  cmMakefileProfilingData *this_local;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    std::operator<<((ostream *)this,",");
    cmsys::SystemInformation::SystemInformation((SystemInformation *)&v.limit_);
    Json::Value::Value((Value *)local_50,nullValue);
    Json::Value::Value(&local_78,"E");
    pVVar2 = Json::Value::operator[]((Value *)local_50,"ph");
    Json::Value::operator=(pVVar2,&local_78);
    Json::Value::~Value(&local_78);
    local_b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_b0.__r = (rep_conflict)
                   std::chrono::
                   time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(&local_b8);
    local_a8.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                             (&local_b0);
    value = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_a8);
    Json::Value::Value(&local_a0,value);
    pVVar2 = Json::Value::operator[]((Value *)local_50,"ts");
    Json::Value::operator=(pVVar2,&local_a0);
    Json::Value::~Value(&local_a0);
    lVar3 = cmsys::SystemInformation::GetProcessId((SystemInformation *)&v.limit_);
    Json::Value::Value(&local_e0,(Int)lVar3);
    pVVar2 = Json::Value::operator[]((Value *)local_50,"pid");
    Json::Value::operator=(pVVar2,&local_e0);
    Json::Value::~Value(&local_e0);
    Json::Value::Value(&local_108,0);
    pVVar2 = Json::Value::operator[]((Value *)local_50,"tid");
    Json::Value::operator=(pVVar2,&local_108);
    Json::Value::~Value(&local_108);
    pSVar4 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::
             operator->(&this->JsonWriter);
    (*pSVar4->_vptr_StreamWriter[2])(pSVar4,local_50,this);
    Json::Value::~Value((Value *)local_50);
    cmsys::SystemInformation::~SystemInformation((SystemInformation *)&v.limit_);
  }
  return;
}

Assistant:

void cmMakefileProfilingData::StopEntry()
{
  /* Do not try again if we previously failed to write to output. */
  if (!this->ProfileStream.good()) {
    return;
  }

  try {
    this->ProfileStream << ",";
    cmsys::SystemInformation info;
    Json::Value v;
    v["ph"] = "E";
    v["ts"] = static_cast<Json::Value::UInt64>(
      std::chrono::duration_cast<std::chrono::microseconds>(
        std::chrono::steady_clock::now().time_since_epoch())
        .count());
    v["pid"] = static_cast<int>(info.GetProcessId());
    v["tid"] = 0;
    this->JsonWriter->write(v, &this->ProfileStream);
  } catch (std::ios_base::failure& fail) {
    cmSystemTools::Error(
      cmStrCat("Failed to write to profiling output:", fail.what()));
  } catch (...) {
    cmSystemTools::Error("Error writing profiling output!");
  }
}